

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

void __thiscall
BayesianGameForDecPOMDPStage::ProbRewardForjoahI
          (BayesianGameForDecPOMDPStage *this,Index ts,Index jtI,Index *jaI_arr,Index *joI_arr,
          Index *jaohI,double *PjaohI,double *ExpR_0_prevTS_thisJAOH)

{
  PlanningUnitDecPOMDPDiscrete *pPVar1;
  DecPOMDPDiscreteInterface *pDVar2;
  Index *pIVar3;
  char cVar4;
  undefined4 uVar5;
  Index IVar6;
  JointActionObservationHistoryTree *this_00;
  JointBeliefInterface *pJVar7;
  LIndex i;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined **local_78;
  long *local_70;
  undefined **local_68;
  ulong local_60;
  Index *local_58;
  Index *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = jaohI;
  this_00 = PlanningUnitMADPDiscrete::GetJointActionObservationHistoryTree
                      (&this->_m_pu->super_PlanningUnitMADPDiscrete,0);
  *PjaohI = 1.0;
  pJVar7 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                     (&this->_m_pu->super_PlanningUnitMADPDiscrete);
  if (ts != 0) {
    local_60 = (ulong)ts;
    uVar8 = 0;
    local_68 = &PTR__BeliefIteratorGeneric_0059cb30;
    local_58 = joI_arr;
    do {
      (**(code **)(*(long *)(&pJVar7->field_0x0 + *(long *)((long)*pJVar7 + -0xb8)) + 0x98))
                (&local_78,&pJVar7->field_0x0 + *(long *)((long)*pJVar7 + -0xb8));
      auVar10 = ZEXT816(0);
      do {
        local_38 = auVar10._0_8_;
        pPVar1 = this->_m_pu;
        uVar5 = (**(code **)(*local_70 + 0x18))();
        pDVar2 = pPVar1->_m_DecPOMDP;
        local_40 = (**(code **)(*(long *)pDVar2 + 0xc0))(pDVar2,uVar5,jaI_arr[uVar8]);
        local_48 = (**(code **)(*local_70 + 0x10))();
        cVar4 = (**(code **)(*local_70 + 0x20))();
        pIVar3 = local_58;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_38;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_48;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_40;
        auVar10 = vfmadd231sd_fma(auVar11,auVar12,auVar10);
      } while (cVar4 != '\0');
      *ExpR_0_prevTS_thisJAOH = auVar10._0_8_ + *ExpR_0_prevTS_thisJAOH;
      this_00 = JointActionObservationHistoryTree::GetSuccessor
                          (this_00,jaI_arr[uVar8],local_58[uVar8]);
      i = TreeNode<JointActionObservationHistory>::GetIndex
                    (&this_00->super_TreeNode<JointActionObservationHistory>);
      IVar6 = Globals::CastLIndexToIndex(i);
      *local_50 = IVar6;
      pDVar2 = this->_m_pu->_m_DecPOMDP;
      dVar9 = (double)(**(code **)((long)*pJVar7 + 0xb0))
                                (pJVar7,(long)&pDVar2->field_0x0 +
                                        *(long *)(*(long *)pDVar2 + -0xb8),jaI_arr[uVar8],
                                 pIVar3[uVar8]);
      *PjaohI = dVar9 * *PjaohI;
      local_78 = local_68;
      if (local_70 != (long *)0x0) {
        (**(code **)(*local_70 + 8))();
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_60);
  }
  if (pJVar7 != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*pJVar7 + 8))(pJVar7);
  }
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::ProbRewardForjoahI(
        //input args
        Index ts, Index jtI, Index* jaI_arr,Index* joI_arr, 
        //output args
        Index& jaohI, double& PjaohI, double& ExpR_0_prevTS_thisJAOH )
{
    //first we get the initial jaoh
    JointActionObservationHistoryTree * jaoht = 
        _m_pu->GetJointActionObservationHistoryTree(0);

    double CPjaohI = 1.0; 
    PjaohI = CPjaohI; // == 1.0

    // get the initaal belief
    JointBeliefInterface* jb = _m_pu->GetNewJointBeliefFromISD();

    Index tI = 0;
    while(tI < ts)
    {
        //calculate the R for tI
        double ExpR_0_prevTS_thisJAOH_thisT = 0.0;
#if USE_BeliefIteratorGeneric
        BeliefIteratorGeneric it=jb->GetIterator();
        do
        {
            double R_si_ja = _m_pu->GetReward(it.GetStateIndex(), jaI_arr[tI]); 
            if(DEBUG_BG4DECPOMDP4) 
                cout << "R(s="<<it.GetStateIndex()<<",ja="<<jaI_arr[tI]<<")="<< R_si_ja << "\n";
            ExpR_0_prevTS_thisJAOH_thisT += it.GetProbability() * R_si_ja;
        } while(it.Next());
#else
        for(Index sI=0; sI < _m_pu->GetNrStates(); sI++)
        {
            double R_si_ja = _m_pu->GetReward(sI, jaI_arr[tI]); 
            if(DEBUG_BG4DECPOMDP4) 
                cout << "R(s="<<sI<<",ja="<<jaI_arr[tI]<<")="<< R_si_ja << "\n";
            ExpR_0_prevTS_thisJAOH_thisT += jb->Get(sI) * R_si_ja;
        }
#endif
        ExpR_0_prevTS_thisJAOH += ExpR_0_prevTS_thisJAOH_thisT;
        if(DEBUG_BG4DECPOMDP4)
        {
            cout << "calculating expected reward R(oaHist,a) for tI="<<tI
                <<"oaHist:"; jaoht->GetJointActionObservationHistory()->Print();
            cout << endl; cout << "R(b,a) (exp reward for jtI="  << jtI << 
                ", tI="<<tI<<") is "<< ExpR_0_prevTS_thisJAOH_thisT <<endl;

        }
            jaoht = jaoht->GetSuccessor( jaI_arr[tI], joI_arr[tI] );
            jaohI = CastLIndexToIndex(jaoht->GetIndex());

            CPjaohI = jb->Update( *_m_pu->GetDPOMDPD(), jaI_arr[tI], joI_arr[tI]  );
        PjaohI =  PjaohI * CPjaohI;     
        tI++;
    }
    delete jb; //free the belief allocated with 'new'
    if(DEBUG_BG4DECPOMDP4)
    {
        cout << "expected previous reward (up to ts-1) for (jtI="  << jtI << 
            ") ";
        jaoht->GetJointActionObservationHistory()->Print();
        cout << " is "<< ExpR_0_prevTS_thisJAOH <<endl << endl;
    }
}